

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O0

bool __thiscall S2CellId::intersects(S2CellId *this,S2CellId other)

{
  bool bVar1;
  ostream *poVar2;
  S2CellId SVar3;
  S2CellId SVar4;
  bool local_a9;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2CellId *local_18;
  S2CellId *this_local;
  S2CellId other_local;
  
  local_18 = this;
  this_local = (S2CellId *)other.id_;
  bVar1 = is_valid(this);
  local_31 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x25c,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Check failed: is_valid() ");
    S2LogMessageVoidify::operator&(&local_19,poVar2);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  bVar1 = is_valid((S2CellId *)&this_local);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x25d,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_58);
    poVar2 = std::operator<<(poVar2,"Check failed: other.is_valid() ");
    S2LogMessageVoidify::operator&(local_45,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  SVar3 = range_min((S2CellId *)&this_local);
  SVar4 = range_max(this);
  bVar1 = operator<=(SVar3,SVar4);
  local_a9 = false;
  if (bVar1) {
    SVar3 = range_max((S2CellId *)&this_local);
    SVar4 = range_min(this);
    local_a9 = operator>=(SVar3,SVar4);
  }
  return local_a9;
}

Assistant:

inline bool S2CellId::intersects(S2CellId other) const {
  S2_DCHECK(is_valid());
  S2_DCHECK(other.is_valid());
  return other.range_min() <= range_max() && other.range_max() >= range_min();
}